

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

void __thiscall amrex::Amr::regrid(Amr *this,int lbase,Real time,bool initial)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  pointer pAVar5;
  Geometry *pGVar6;
  BoxArray *pBVar7;
  DistributionMapping *pDVar8;
  long *plVar9;
  type pAVar10;
  ostream *poVar11;
  Print *this_00;
  byte in_DL;
  uint in_ESI;
  long in_RDI;
  bool bVar12;
  double in_XMM0_Qa;
  int lev_4;
  AmrLevel *a;
  int lev_3;
  int lev_2;
  int lev_1;
  int End;
  int lev;
  bool grids_unchanged;
  int start;
  bool regrid_level_zero;
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> new_dmap;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> new_grid_places;
  int new_finest;
  undefined4 in_stack_fffffffffffff778;
  int in_stack_fffffffffffff77c;
  Print *in_stack_fffffffffffff780;
  undefined8 in_stack_fffffffffffff788;
  AmrMesh *in_stack_fffffffffffff790;
  BoxArray *in_stack_fffffffffffff798;
  BoxArray *in_stack_fffffffffffff7a0;
  BoxArray *in_stack_fffffffffffff7a8;
  Print *in_stack_fffffffffffff7b0;
  undefined8 in_stack_fffffffffffff7e8;
  Print *in_stack_fffffffffffff7f0;
  ostream *in_stack_fffffffffffff7f8;
  Amr *in_stack_fffffffffffff800;
  int local_734;
  bool local_722;
  bool local_721;
  int in_stack_fffffffffffff940;
  int in_stack_fffffffffffff944;
  ostream *in_stack_fffffffffffff948;
  AmrCore *in_stack_fffffffffffff950;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *in_stack_fffffffffffffad0;
  int *in_stack_fffffffffffffad8;
  Real in_stack_fffffffffffffae0;
  int in_stack_fffffffffffffaec;
  Amr *in_stack_fffffffffffffaf0;
  int local_3bc;
  int local_3a0;
  uint local_39c;
  int local_398;
  BoxArray *in_stack_fffffffffffffd30;
  Real in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd44;
  Amr *in_stack_fffffffffffffd48;
  int local_200;
  uint local_1b8 [102];
  int local_20;
  byte local_19;
  double local_18;
  uint local_c;
  
  local_19 = in_DL & 1;
  local_20 = *(int *)(in_RDI + 0xc) + -1;
  local_18 = in_XMM0_Qa;
  local_c = in_ESI;
  piVar4 = std::min<int>((int *)(in_RDI + 0x94),&local_20);
  if ((int)in_ESI <= *piVar4) {
    if (0 < *(int *)(in_RDI + 8)) {
      OutStream();
      Print::Print(in_stack_fffffffffffff7b0,(ostream *)in_stack_fffffffffffff7a8);
      Print::operator<<(in_stack_fffffffffffff780,
                        (char (*) [33])CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778)
                       );
      Print::operator<<(in_stack_fffffffffffff780,
                        (int *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
      Print::operator<<(in_stack_fffffffffffff780,
                        (char (*) [2])CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778))
      ;
      Print::~Print(in_stack_fffffffffffff7f0);
    }
    std::allocator<amrex::BoxArray>::allocator((allocator<amrex::BoxArray> *)0x10ecd82);
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffff780,
               CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
               (allocator_type *)0x10ecd9f);
    std::allocator<amrex::BoxArray>::~allocator((allocator<amrex::BoxArray> *)0x10ecdae);
    std::allocator<amrex::DistributionMapping>::allocator
              ((allocator<amrex::DistributionMapping> *)0x10ecdda);
    Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               in_stack_fffffffffffff780,
               CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
               (allocator_type *)0x10ecdf7);
    std::allocator<amrex::DistributionMapping>::~allocator
              ((allocator<amrex::DistributionMapping> *)0x10ece06);
    grid_places(in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec,in_stack_fffffffffffffae0,
                in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
    local_721 = false;
    if (((local_19 & 1) == 0) && (local_721 = false, local_c == 0)) {
      local_722 = true;
      if (*(int *)(in_RDI + 0x978) == 0) {
        Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                  ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                   in_stack_fffffffffffff780,
                   CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
        Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                      *)in_stack_fffffffffffff780,
                     CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
        pAVar5 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                           ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                            0x10eceb6);
        AmrLevel::boxArray(pAVar5);
        local_722 = BoxArray::operator!=
                              ((BoxArray *)in_stack_fffffffffffff780,
                               (BoxArray *)
                               CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
      }
      local_721 = local_722;
    }
    if (local_721 == false) {
      local_734 = local_c + 1;
    }
    else {
      local_734 = 0;
    }
    bVar12 = *(uint *)(in_RDI + 0x94) == local_1b8[0];
    local_200 = local_734;
    piVar4 = std::min<int>((int *)(in_RDI + 0x94),(int *)local_1b8);
    iVar3 = *piVar4;
    for (; local_200 <= iVar3; local_200 = local_200 + 1) {
      Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                 in_stack_fffffffffffff780,
                 CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
      Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                    *)in_stack_fffffffffffff780,
                   CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
      pAVar5 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                         ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                          0x10ecfdb);
      AmrLevel::boxArray(pAVar5);
      bVar2 = BoxArray::operator==(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
      if (bVar2) {
        Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                      *)in_stack_fffffffffffff780,
                     CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
        pAVar5 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                           ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                            0x10ed020);
        AmrLevel::boxArray(pAVar5);
        Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                  ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                   in_stack_fffffffffffff780,
                   CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
        BoxArray::operator=((BoxArray *)in_stack_fffffffffffff780,
                            (BoxArray *)
                            CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
        Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                      *)in_stack_fffffffffffff780,
                     CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
        pAVar5 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                           ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                            0x10ed079);
        AmrLevel::DistributionMap(pAVar5);
        Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
                  ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                    *)in_stack_fffffffffffff780,
                   CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
        DistributionMapping::operator=
                  ((DistributionMapping *)in_stack_fffffffffffff780,
                   (DistributionMapping *)
                   CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
      }
      else {
        bVar12 = false;
      }
    }
    if (((anonymous_namespace)::use_efficient_regrid == 1) && (bVar12)) {
      if (0 < *(int *)(in_RDI + 8)) {
        OutStream();
        Print::Print(in_stack_fffffffffffff7b0,(ostream *)in_stack_fffffffffffff7a8);
        Print::operator<<(in_stack_fffffffffffff780,
                          (char (*) [29])
                          CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
        Print::operator<<(in_stack_fffffffffffff780,
                          (int *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
        Print::operator<<(in_stack_fffffffffffff780,
                          (char (*) [22])
                          CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
        Print::~Print(in_stack_fffffffffffff7f0);
      }
    }
    else {
      for (local_398 = local_734; local_39c = local_1b8[0], local_398 <= *(int *)(in_RDI + 0x94);
          local_398 = local_398 + 1) {
        Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                      *)in_stack_fffffffffffff780,
                     CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
        pAVar5 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                           ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                            0x10ed26d);
        iVar3 = AmrLevel::postStepRegrid(pAVar5);
        if (iVar3 == 0) {
          Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
          ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        *)in_stack_fffffffffffff780,
                       CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
          pAVar5 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::
                   operator->((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                              0x10ed29e);
          (*pAVar5->_vptr_AmrLevel[0x1a])();
        }
      }
      while (local_39c = local_39c + 1, (int)local_39c <= *(int *)(in_RDI + 0x94)) {
        Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                      *)in_stack_fffffffffffff780,
                     CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
        std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::reset
                  ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                   in_stack_fffffffffffff780,
                   (pointer)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
        AmrMesh::ClearBoxArray
                  ((AmrMesh *)in_stack_fffffffffffff7f0,
                   (int)((ulong)in_stack_fffffffffffff7e8 >> 0x20));
        AmrMesh::ClearDistributionMap
                  (in_stack_fffffffffffff790,(int)((ulong)in_stack_fffffffffffff788 >> 0x20));
      }
      *(uint *)(in_RDI + 0x94) = local_1b8[0];
      for (local_3a0 = local_734; local_3a0 <= (int)local_1b8[0]; local_3a0 = local_3a0 + 1) {
        if ((*(int *)(in_RDI + 0x978) == 0) || ((local_19 & 1) != 0)) {
          Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
          operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                      *)in_stack_fffffffffffff780,
                     CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
          bVar12 = DistributionMapping::empty((DistributionMapping *)0x10ed459);
          if (bVar12) {
            Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
            operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        *)in_stack_fffffffffffff780,
                       CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
            Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                      ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                       in_stack_fffffffffffff780,
                       CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
            ParallelDescriptor::NProcs();
            DistributionMapping::define
                      ((DistributionMapping *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,
                       (int)((ulong)in_stack_fffffffffffff7a0 >> 0x20));
          }
        }
        else {
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                    ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                     in_stack_fffffffffffff780,
                     CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
          makeLoadBalanceDistributionMap
                    (in_stack_fffffffffffffd48,in_stack_fffffffffffffd44,in_stack_fffffffffffffd38,
                     in_stack_fffffffffffffd30);
          Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
          operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                      *)in_stack_fffffffffffff780,
                     CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
          DistributionMapping::operator=
                    ((DistributionMapping *)in_stack_fffffffffffff780,
                     (DistributionMapping *)
                     CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
          DistributionMapping::~DistributionMapping((DistributionMapping *)0x10ed43a);
        }
        plVar9 = *(long **)(in_RDI + 0x968);
        pGVar6 = AmrMesh::Geom((AmrMesh *)in_stack_fffffffffffff780,in_stack_fffffffffffff77c);
        pBVar7 = Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                           ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                            in_stack_fffffffffffff780,
                            CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
        pDVar8 = Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
                 operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                             *)in_stack_fffffffffffff780,
                            CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
        plVar9 = (long *)(**(code **)(*plVar9 + 0x30))
                                   (*(undefined8 *)(in_RDI + 0x140),plVar9,in_RDI,local_3a0,pGVar6,
                                    pBVar7,pDVar8);
        if ((local_19 & 1) == 0) {
          Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
          ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        *)in_stack_fffffffffffff780,
                       CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
          bVar12 = std::unique_ptr::operator_cast_to_bool
                             ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                              0x10ed697);
          if (bVar12) {
            Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
            ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                          *)in_stack_fffffffffffff780,
                         CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
            pAVar10 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::
                      operator*((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                 *)in_stack_fffffffffffff780);
            (**(code **)(*plVar9 + 0xd8))(plVar9,pAVar10);
            Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
            ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                          *)in_stack_fffffffffffff780,
                         CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
            std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::reset
                      ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                       in_stack_fffffffffffff780,
                       (pointer)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
            Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
            ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                          *)in_stack_fffffffffffff780,
                         CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
            pAVar5 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::
                     operator->((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                 *)0x10ed75a);
            AmrLevel::boxArray(pAVar5);
            AmrMesh::SetBoxArray
                      (in_stack_fffffffffffff790,(int)((ulong)in_stack_fffffffffffff788 >> 0x20),
                       (BoxArray *)in_stack_fffffffffffff780);
            Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
            ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                          *)in_stack_fffffffffffff780,
                         CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
            pAVar5 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::
                     operator->((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                 *)0x10ed7ab);
            AmrLevel::DistributionMap(pAVar5);
            AmrMesh::SetDistributionMap
                      (in_stack_fffffffffffff790,(int)((ulong)in_stack_fffffffffffff788 >> 0x20),
                       (DistributionMapping *)in_stack_fffffffffffff780);
          }
          else {
            (**(code **)(*plVar9 + 0xe0))();
            Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
            ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                          *)in_stack_fffffffffffff780,
                         CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
            std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::reset
                      ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                       in_stack_fffffffffffff780,
                       (pointer)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
            if (0 < local_3a0) {
              piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                                 ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff780,
                                  CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
              iVar3 = *piVar4;
              piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                                 ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff780,
                                  CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
              iVar1 = *piVar4;
              piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                                 ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff780,
                                  CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
              *piVar4 = iVar3 * iVar1;
            }
            Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
            ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                          *)in_stack_fffffffffffff780,
                         CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
            pAVar5 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::
                     operator->((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                 *)0x10ed8d5);
            AmrLevel::boxArray(pAVar5);
            AmrMesh::SetBoxArray
                      (in_stack_fffffffffffff790,(int)((ulong)in_stack_fffffffffffff788 >> 0x20),
                       (BoxArray *)in_stack_fffffffffffff780);
            Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
            ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                          *)in_stack_fffffffffffff780,
                         CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
            pAVar5 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::
                     operator->((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                 *)0x10ed926);
            AmrLevel::DistributionMap(pAVar5);
            AmrMesh::SetDistributionMap
                      (in_stack_fffffffffffff790,(int)((ulong)in_stack_fffffffffffff788 >> 0x20),
                       (DistributionMapping *)in_stack_fffffffffffff780);
          }
        }
        else {
          Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
          ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        *)in_stack_fffffffffffff780,
                       CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
          std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::reset
                    ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                     in_stack_fffffffffffff780,
                     (pointer)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
          Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
          ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        *)in_stack_fffffffffffff780,
                       CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
          pAVar5 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::
                   operator->((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                              0x10ed5dc);
          AmrLevel::boxArray(pAVar5);
          AmrMesh::SetBoxArray
                    (in_stack_fffffffffffff790,(int)((ulong)in_stack_fffffffffffff788 >> 0x20),
                     (BoxArray *)in_stack_fffffffffffff780);
          Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
          ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        *)in_stack_fffffffffffff780,
                       CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
          pAVar5 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::
                   operator->((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                              0x10ed621);
          AmrLevel::DistributionMap(pAVar5);
          AmrMesh::SetDistributionMap
                    (in_stack_fffffffffffff790,(int)((ulong)in_stack_fffffffffffff788 >> 0x20),
                     (DistributionMapping *)in_stack_fffffffffffff780);
          Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
          ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        *)in_stack_fffffffffffff780,
                       CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
          pAVar5 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::
                   operator->((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                              0x10ed65d);
          (*pAVar5->_vptr_AmrLevel[0x17])();
        }
      }
      for (local_3bc = 0; local_3bc <= (int)local_1b8[0]; local_3bc = local_3bc + 1) {
        Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                      *)in_stack_fffffffffffff780,
                     CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
        pAVar5 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                           ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                            0x10ed99e);
        (*pAVar5->_vptr_AmrLevel[0x13])(pAVar5,(ulong)local_c,(ulong)local_1b8[0]);
      }
      if ((*(int *)(in_RDI + 0x2c8) != 0) && (bVar12 = ParallelDescriptor::IOProcessor(), bVar12)) {
        poVar11 = std::operator<<((ostream *)(in_RDI + 0x4d0),"REGRID: at level lbase = ");
        in_stack_fffffffffffff800 = (Amr *)std::ostream::operator<<(poVar11,local_c);
        std::operator<<((ostream *)in_stack_fffffffffffff800,'\n');
        printGridInfo(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                      (int)((ulong)in_stack_fffffffffffff7f0 >> 0x20),(int)in_stack_fffffffffffff7f0
                     );
      }
      if ((*(int *)(in_RDI + 0x2c4) != 0) && (bVar12 = ParallelDescriptor::IOProcessor(), bVar12)) {
        if (local_c == 0) {
          in_stack_fffffffffffff7f8 = std::operator<<((ostream *)(in_RDI + 0x2d0),"STEP = ");
          piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                             ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff780,
                              CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
          in_stack_fffffffffffff7f0 =
               (Print *)std::ostream::operator<<(in_stack_fffffffffffff7f8,*piVar4);
          std::operator<<((ostream *)in_stack_fffffffffffff7f0,' ');
        }
        poVar11 = std::operator<<((ostream *)(in_RDI + 0x2d0),"TIME = ");
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_18);
        poVar11 = std::operator<<(poVar11," : REGRID  with lbase = ");
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_c);
        std::operator<<(poVar11,'\n');
        printGridInfo(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                      (int)((ulong)in_stack_fffffffffffff7f0 >> 0x20),(int)in_stack_fffffffffffff7f0
                     );
      }
      if ((0 < *(int *)(in_RDI + 8)) && (bVar12 = ParallelDescriptor::IOProcessor(), bVar12)) {
        if (local_c == 0) {
          OutStream();
          Print::Print(in_stack_fffffffffffff7b0,(ostream *)in_stack_fffffffffffff7a8);
          Print::operator<<(in_stack_fffffffffffff780,
                            (char (*) [8])
                            CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
          Vector<int,_std::allocator<int>_>::operator[]
                    ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff780,
                     CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
          Print::operator<<(in_stack_fffffffffffff780,
                            (int *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
          Print::operator<<(in_stack_fffffffffffff780,
                            (char *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
          Print::~Print(in_stack_fffffffffffff7f0);
        }
        this_00 = (Print *)OutStream();
        Print::Print(this_00,(ostream *)in_stack_fffffffffffff7a8);
        Print::operator<<(in_stack_fffffffffffff780,
                          (char (*) [8])
                          CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
        Print::operator<<(in_stack_fffffffffffff780,
                          (double *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
        Print::operator<<(in_stack_fffffffffffff780,
                          (char (*) [25])
                          CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
        Print::operator<<(in_stack_fffffffffffff780,
                          (int *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
        Print::operator<<(in_stack_fffffffffffff780,
                          (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                           *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
        Print::~Print(in_stack_fffffffffffff7f0);
        if (*(int *)(in_RDI + 8) < 2) {
          OutStream();
          AmrCore::printGridSummary
                    (in_stack_fffffffffffff950,in_stack_fffffffffffff948,in_stack_fffffffffffff944,
                     in_stack_fffffffffffff940);
        }
        else {
          OutStream();
          printGridInfo(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                        (int)((ulong)in_stack_fffffffffffff7f0 >> 0x20),
                        (int)in_stack_fffffffffffff7f0);
        }
      }
    }
    Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~Vector
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               0x10eddd9);
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~Vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x10edde6);
  }
  return;
}

Assistant:

void
Amr::regrid (int  lbase,
             Real time,
             bool initial)
{
    BL_PROFILE("Amr::regrid()");

    if (lbase > std::min(finest_level,max_level-1)) return;

    if (verbose > 0)
        amrex::Print() << "Now regridding at level lbase = " << lbase << "\n";

    //
    // Compute positions of new grids.
    //
    int             new_finest;
    Vector<BoxArray> new_grid_places(max_level+1);
    Vector<DistributionMapping> new_dmap(max_level+1);

    grid_places(lbase,time,new_finest, new_grid_places);

    bool regrid_level_zero = (!initial) && (lbase == 0)
        && ( loadbalance_with_workestimates || (new_grid_places[0] != amr_level[0]->boxArray()));

    const int start = regrid_level_zero ? 0 : lbase+1;

    bool grids_unchanged = finest_level == new_finest;
    for (int lev = start, End = std::min(finest_level,new_finest); lev <= End; lev++) {
        if (new_grid_places[lev] == amr_level[lev]->boxArray()) {
            new_grid_places[lev] = amr_level[lev]->boxArray();  // to avoid duplicates
            new_dmap[lev] = amr_level[lev]->DistributionMap();
        } else {
            grids_unchanged = false;
        }
    }

    //
    // If use_efficient_regrid flag is set and grids are unchanged, then don't do anything more here.
    //
    if (use_efficient_regrid == 1 && grids_unchanged )
    {
        if (verbose > 0) {
            amrex::Print() << "Regridding at level lbase = " << lbase
                           << " but grids unchanged\n";
        }
        return;
    }

    //
    // Reclaim old-time grid space for all remain levels > lbase.
    // But skip this if we're in the middle of a post-timestep regrid.
    //
    for(int lev = start; lev <= finest_level; ++lev) {
        if (!amr_level[lev]->postStepRegrid()) {
            amr_level[lev]->removeOldData();
        }
    }
    //
    // Reclaim all remaining storage for levels > new_finest.
    //
    for(int lev = new_finest + 1; lev <= finest_level; ++lev) {
        amr_level[lev].reset();
        this->ClearBoxArray(lev);
        this->ClearDistributionMap(lev);
    }

    finest_level = new_finest;

    //
    // Define the new grids from level start up to new_finest.
    //
    for(int lev = start; lev <= new_finest; ++lev) {
        //
        // Construct skeleton of new level.
        //

        if (loadbalance_with_workestimates && !initial) {
            new_dmap[lev] = makeLoadBalanceDistributionMap(lev, time, new_grid_places[lev]);
        }
        else if (new_dmap[lev].empty()) {
            new_dmap[lev].define(new_grid_places[lev]);
        }

        AmrLevel* a = (*levelbld)(*this,lev,Geom(lev),new_grid_places[lev],
                                  new_dmap[lev],cumtime);

        if (initial)
        {
            //
            // We're being called on startup from bldFineLevels().
            // NOTE: The initData function may use a filPatch, and so needs to
            //       be officially inserted into the hierarchy prior to the call.
            //
            amr_level[lev].reset(a);
            this->SetBoxArray(lev, amr_level[lev]->boxArray());
            this->SetDistributionMap(lev, amr_level[lev]->DistributionMap());
            amr_level[lev]->initData();
        }
        else if (amr_level[lev])
        {
            //
            // Init with data from old structure then remove old structure.
            // NOTE: The init function may use a filPatch from the old level,
            //       which therefore needs remain in the hierarchy during the call.
            //
            a->init(*amr_level[lev]);
            amr_level[lev].reset(a);
            this->SetBoxArray(lev, amr_level[lev]->boxArray());
            this->SetDistributionMap(lev, amr_level[lev]->DistributionMap());
        }
        else
        {
            a->init();
            amr_level[lev].reset(a);
            if (lev > 0)
                level_steps[lev] = level_steps[lev-1] * n_cycle[lev-1];
            this->SetBoxArray(lev, amr_level[lev]->boxArray());
            this->SetDistributionMap(lev, amr_level[lev]->DistributionMap());
        }

    }


    //
    // Check at *all* levels whether we need to do anything special now that the grids
    //       at levels lbase+1 and higher may have changed.
    //
    for(int lev(0); lev <= new_finest; ++lev) {
        amr_level[lev]->post_regrid(lbase,new_finest);
    }

    //
    // Report creation of new grids.
    //

    if (record_run_info && ParallelDescriptor::IOProcessor())
    {
        runlog << "REGRID: at level lbase = " << lbase << '\n';
        printGridInfo(runlog,start,finest_level);
    }

    if (record_grid_info && ParallelDescriptor::IOProcessor())
    {
        if (lbase == 0)
            gridlog << "STEP = " << level_steps[0] << ' ';

        gridlog << "TIME = "
                << time
                << " : REGRID  with lbase = "
                << lbase
                << '\n';

        printGridInfo(gridlog,start,finest_level);
    }

    if (verbose > 0 && ParallelDescriptor::IOProcessor())
    {
        if (lbase == 0) {
            amrex::Print() << "STEP = " << level_steps[0] << ' ';
        }

        amrex::Print() << "TIME = "
                       << time
                       << " : REGRID  with lbase = "
                       << lbase
                       << std::endl;

        if (verbose > 1)
        {
            printGridInfo(amrex::OutStream(),start,finest_level);
        }
        else
        {
            printGridSummary(amrex::OutStream(),start,finest_level);
        }
    }
}